

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,torrent_peer *p,torrent_state *state)

{
  _Elt_pointer pptVar1;
  bool bVar2;
  _Elt_pointer pptVar3;
  long lVar4;
  _Map_pointer ppptVar5;
  _Elt_pointer pptVar6;
  long lVar7;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  _Elt_pointer local_110;
  iterator local_d0;
  _Elt_pointer local_b0;
  _Elt_pointer local_a8;
  _Elt_pointer local_a0;
  _Map_pointer local_98;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Elt_pointer local_80;
  _Map_pointer local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_50 = *(undefined4 *)
              &(this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uStack_4c = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur + 4);
  uStack_48 = *(undefined4 *)
               &(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
  uStack_44 = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first + 4);
  local_40 = *(undefined4 *)
              &(this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
  uStack_3c = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last + 4);
  uStack_38 = *(undefined4 *)
               &(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
  uStack_34 = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
  local_70 = *(undefined4 *)
              &(this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uStack_6c = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
  uStack_68 = *(undefined4 *)
               &(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first;
  uStack_64 = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
  local_60 = *(undefined4 *)
              &(this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
  uStack_5c = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
  uStack_58 = *(undefined4 *)
               &(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uStack_54 = *(undefined4 *)
               ((long)&(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  ::std::
  __equal_range<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,libtorrent::aux::torrent_peer*,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::peer_address_compare>>
            (&local_b0);
  pptVar1 = local_90;
  local_110 = local_a8;
  lVar7 = (long)local_90 - (long)local_88 >> 3;
  lVar4 = (long)(((long)local_a0 - (long)local_b0 >> 3) + lVar7 +
                (((ulong)((long)local_78 - (long)local_98) >> 3) -
                (ulong)(local_78 != (_Map_pointer)0x0)) * 0x40) >> 2;
  pptVar3 = local_a0;
  ppptVar5 = local_98;
  pptVar6 = local_b0;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = torrent_peer_equal(*pptVar6,p);
      local_d0._M_last = pptVar3;
      local_d0._M_node = ppptVar5;
      local_d0._M_cur = pptVar6;
      if (bVar2) goto LAB_002896bd;
      pptVar6 = pptVar6 + 1;
      if (pptVar6 == pptVar3) {
        pptVar6 = ppptVar5[1];
        ppptVar5 = ppptVar5 + 1;
        pptVar3 = pptVar6 + 0x40;
        local_110 = pptVar6;
      }
      bVar2 = torrent_peer_equal(*pptVar6,p);
      local_d0._M_last = pptVar3;
      local_d0._M_node = ppptVar5;
      local_d0._M_cur = pptVar6;
      if (bVar2) goto LAB_002896bd;
      pptVar6 = pptVar6 + 1;
      if (pptVar6 == pptVar3) {
        pptVar6 = ppptVar5[1];
        ppptVar5 = ppptVar5 + 1;
        pptVar3 = pptVar6 + 0x40;
        local_110 = pptVar6;
      }
      bVar2 = torrent_peer_equal(*pptVar6,p);
      local_d0._M_last = pptVar3;
      local_d0._M_node = ppptVar5;
      local_d0._M_cur = pptVar6;
      if (bVar2) goto LAB_002896bd;
      pptVar6 = pptVar6 + 1;
      if (pptVar6 == pptVar3) {
        pptVar6 = ppptVar5[1];
        ppptVar5 = ppptVar5 + 1;
        pptVar3 = pptVar6 + 0x40;
        local_110 = pptVar6;
      }
      bVar2 = torrent_peer_equal(*pptVar6,p);
      local_d0._M_last = pptVar3;
      local_d0._M_node = ppptVar5;
      local_d0._M_cur = pptVar6;
      if (bVar2) goto LAB_002896bd;
      pptVar6 = pptVar6 + 1;
      if (pptVar6 == pptVar3) {
        pptVar6 = ppptVar5[1];
        ppptVar5 = ppptVar5 + 1;
        pptVar3 = pptVar6 + 0x40;
        local_110 = pptVar6;
      }
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pptVar3 - (long)pptVar6 >> 3) + lVar7 +
          (((ulong)((long)local_78 - (long)ppptVar5) >> 3) - (ulong)(local_78 != (_Map_pointer)0x0))
          * 0x40;
  if (lVar4 == 1) {
LAB_00289694:
    bVar2 = torrent_peer_equal(*pptVar6,p);
    local_d0._M_last = pptVar3;
    local_d0._M_node = ppptVar5;
    local_d0._M_cur = pptVar6;
    if (bVar2) goto LAB_002896bd;
  }
  else {
    if (lVar4 == 2) {
LAB_00289664:
      bVar2 = torrent_peer_equal(*pptVar6,p);
      local_d0._M_last = pptVar3;
      local_d0._M_node = ppptVar5;
      local_d0._M_cur = pptVar6;
      if (bVar2) goto LAB_002896bd;
      pptVar6 = pptVar6 + 1;
      if (pptVar6 == pptVar3) {
        pptVar6 = ppptVar5[1];
        ppptVar5 = ppptVar5 + 1;
        pptVar3 = pptVar6 + 0x40;
        local_110 = pptVar6;
      }
      goto LAB_00289694;
    }
    if (lVar4 == 3) {
      bVar2 = torrent_peer_equal(*pptVar6,p);
      local_d0._M_last = pptVar3;
      local_d0._M_node = ppptVar5;
      local_d0._M_cur = pptVar6;
      if (bVar2) goto LAB_002896bd;
      pptVar6 = pptVar6 + 1;
      if (pptVar6 == pptVar3) {
        pptVar6 = ppptVar5[1];
        ppptVar5 = ppptVar5 + 1;
        pptVar3 = pptVar6 + 0x40;
        local_110 = pptVar6;
      }
      goto LAB_00289664;
    }
  }
  local_110 = local_88;
  local_d0._M_last = local_80;
  local_d0._M_node = local_78;
  local_d0._M_cur = pptVar1;
LAB_002896bd:
  if (local_d0._M_cur != local_90) {
    local_d0._M_first = local_110;
    erase_peer(this,&local_d0,state);
  }
  return;
}

Assistant:

void peer_list::erase_peer(torrent_peer* p, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(m_locked_peer != p);

		auto const range = std::equal_range(m_peers.begin(), m_peers.end(), p, peer_address_compare{});
		auto const iter = std::find_if(range.first, range.second, [&](torrent_peer const* needle) {
			return torrent_peer_equal(needle, p);
		});
		if (iter == range.second) return;
		erase_peer(iter, state);
	}